

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

void http1_websocket_client_on_failed(http_s *h)

{
  code *pcVar1;
  http_settings_s *phVar2;
  
  pcVar1 = *(code **)((long)h->udata + 0x20);
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(0,*(undefined8 *)((long)h->udata + 0x28));
  }
  fio_free(h->udata);
  phVar2 = http_settings(h);
  phVar2->udata = (void *)0x0;
  h->udata = (void *)0x0;
  return;
}

Assistant:

static void http1_websocket_client_on_failed(http_s *h) {
  websocket_settings_s *s = h->udata;
  if (s->on_close)
    s->on_close(0, s->udata);
  fio_free(h->udata);
  h->udata = http_settings(h)->udata = NULL;
}